

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_totype(lua_State *L,TValue *ra,TValue *rb)

{
  TString *name;
  int iVar1;
  
  if (ra->tt_ != 0) {
    if (rb->tt_ != 0x8004) {
      luaG_runerror(L,"type name must be string");
    }
    name = (TString *)(rb->value_).gc;
    if ((name->tt & 0xf) != 4) {
      __assert_fail("(((((rb)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xc86,"void raviV_op_totype(lua_State *, TValue *, TValue *)");
    }
    iVar1 = raviV_check_usertype(L,name,ra);
    if (iVar1 == 0) {
      luaG_runerror(L,"type mismatch: expected %s",name + 1);
    }
  }
  return;
}

Assistant:

void raviV_op_totype(lua_State *L, TValue *ra, TValue *rb) {
  if (ttisnil(ra))
    return;
  if (!ttisshrstring(rb)) luaG_runerror(L, "type name must be string");
  TString *key = tsvalue(rb);
  if (!raviV_check_usertype(L, key, ra))
    luaG_runerror(L, "type mismatch: expected %s", getstr(key));
}